

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::cosDeriv(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *deriv;
  expr_value local_38 [2];
  expr_node *in_stack_ffffffffffffffd8;
  expr_value local_20;
  expr_node *local_18;
  
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_20,2);
  expr_node::expr_node(peVar1,'\x05',&local_20);
  local_18 = peVar1;
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)local_38,9);
  expr_node::expr_node(peVar1,'\x05',local_38);
  local_18->right = peVar1;
  peVar1 = Copy(in_stack_ffffffffffffffd8);
  local_18->right->right = peVar1;
  Link(local_18->right,(expr_node *)0x0,local_18->right->right);
  Link(local_18,(expr_node *)0x0,local_18->right);
  return local_18;
}

Assistant:

expr_node* expr_tree::cosDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)SUB);
    deriv->right = new expr_node(OP, (long)SIN);
    deriv->right->right = Copy(node->right);
    Link(deriv->right, nullptr, deriv->right->right);
    Link(deriv, nullptr, deriv->right);
    return deriv;
}